

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testValid_Classifier_PredictedFeatureName(void)

{
  Rep *pRVar1;
  string *psVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *this;
  StringFeatureType *this_00;
  ostream *poVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  void **ppvVar10;
  Model spec;
  Result res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  FeatureDescription feature;
  TensorAttributes tensorAttributesIn;
  string labels [4];
  Model MStack_198;
  vector<long,_std::allocator<long>_> local_168;
  _func_int **local_150;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  TensorAttributes local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  CoreML::Specification::Model::Model(&MStack_198);
  CoreML::Result::Result((Result *)&local_150);
  local_c8.name._0_4_ = 0x3278c5;
  local_c8.name._4_4_ = 0;
  local_c8.dimension = 3;
  local_c8._12_4_ = 0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"2","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"3","");
  plVar8 = local_48;
  local_58[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"4","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_110,
             &local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 2),
             (allocator_type *)local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_128,&local_110);
  local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buildBasicNeuralNetworkClassifierModel(&MStack_198,true,&local_c8,&local_128,&local_168,true);
  if (local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  MStack_198.specificationversion_ = 4;
  if (MStack_198.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    MStack_198.description_ = pMVar4;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&((MStack_198.description_)->traininginput_).super_RepeatedPtrFieldBase);
  pMVar4 = MStack_198.description_;
  if (MStack_198.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  pRVar1 = (pMVar4->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  lVar9 = (long)(pMVar4->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar9 != 0) {
    lVar7 = 0;
    do {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)local_f8,*(FeatureDescription **)((long)ppvVar10 + lVar7));
      if (MStack_198.description_ == (ModelDescription *)0x0) {
        pMVar4 = (ModelDescription *)operator_new(0x78);
        CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
        MStack_198.description_ = pMVar4;
      }
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&((MStack_198.description_)->traininginput_).super_RepeatedPtrFieldBase,
                          (Type *)0x0);
      CoreML::Specification::FeatureDescription::CopyFrom(pTVar5,(FeatureDescription *)local_f8);
      CoreML::Specification::FeatureDescription::~FeatureDescription((FeatureDescription *)local_f8)
      ;
      lVar7 = lVar7 + 8;
    } while (lVar9 * 8 != lVar7);
  }
  if (MStack_198.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    MStack_198.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((MStack_198.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  pMVar4 = MStack_198.description_;
  if (MStack_198.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  psVar2 = (pTVar5->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&pTVar5->name_,(pMVar4->predictedfeaturename_).ptr_);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  this = pTVar5->type_;
  if (this == (FeatureType *)0x0) {
    this = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(this);
    pTVar5->type_ = this;
  }
  if (this->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(this);
    this->_oneof_case_[0] = 3;
    this_00 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(this_00);
    (this->Type_).stringtype_ = this_00;
  }
  CoreML::Model::validate((Result *)local_f8,&MStack_198);
  local_150 = (_func_int **)local_f8;
  std::__cxx11::string::operator=((string *)&local_148,(string *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,(ulong)(local_e0._M_allocated_capacity + 1));
  }
  bVar3 = CoreML::Result::good((Result *)&local_150);
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x8d6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  lVar9 = -0x80;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_p != &local_138) {
    operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_198);
  return (uint)!bVar3;
}

Assistant:

int testValid_Classifier_PredictedFeatureName() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    // Re-adding model inputs and the predicted feature name to classifier's training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(spec.description().predictedfeaturename());
    trainingInput->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}